

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int jrtplib::GetAutoSockets
              (uint32_t bindIP,bool allowOdd,bool rtcpMux,SocketType *pRtpSock,SocketType *pRtcpSock
              ,uint16_t *pRtpPort,uint16_t *pRtcpPort)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000031;
  uint uVar9;
  int unaff_R15D;
  vector<int,_std::allocator<int>_> toClose;
  SocketType sock2;
  sockaddr_in addr;
  int local_90;
  uint16_t local_8a;
  int *local_88;
  iterator iStack_80;
  int *local_78;
  int local_6c;
  sockaddr local_68;
  uint local_50;
  undefined4 local_4c;
  int *local_48;
  int *local_40;
  ushort *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000011,rtcpMux);
  local_88 = (int *)0x0;
  iStack_80._M_current = (int *)0x0;
  local_78 = (int *)0x0;
  uVar9 = bindIP >> 0x18 | (bindIP & 0xff0000) >> 8 | (bindIP & 0xff00) << 8 | bindIP << 0x18;
  iVar8 = 0;
  local_50 = (uint)CONCAT71(in_register_00000031,allowOdd) ^ 1;
  local_48 = pRtpSock;
  local_40 = pRtcpSock;
  local_38 = pRtpPort;
  do {
    if (iVar8 == 0x400) {
      iVar3 = -0xa1;
      if (iStack_80._M_current != local_88) {
        uVar7 = 0;
        do {
          close(local_88[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 2));
      }
      break;
    }
    local_90 = socket(2,2,0);
    if (local_90 == -1) {
      iVar3 = -0x4b;
      if (iStack_80._M_current != local_88) {
        uVar7 = 0;
        do {
          close(local_88[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 2));
      }
LAB_00120d0d:
      bVar1 = false;
    }
    else {
      local_68.sa_data[6] = '\0';
      local_68.sa_data[7] = '\0';
      local_68.sa_data[8] = '\0';
      local_68.sa_data[9] = '\0';
      local_68.sa_data[10] = '\0';
      local_68.sa_data[0xb] = '\0';
      local_68.sa_data[0xc] = '\0';
      local_68.sa_data[0xd] = '\0';
      local_68.sa_data._2_4_ = uVar9;
      local_68._0_4_ = 2;
      iVar3 = bind(local_90,&local_68,0x10);
      if (iVar3 != 0) {
        close(local_90);
        iVar3 = -0xa0;
        if (iStack_80._M_current != local_88) {
          uVar7 = 0;
          do {
            close(local_88[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar7 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 2));
        }
        goto LAB_00120d0d;
      }
      local_8a = 0;
      iVar3 = GetIPv4SocketPort(local_90,&local_8a);
      if (iVar3 < 0) {
        close(local_90);
        if (iStack_80._M_current != local_88) {
          uVar7 = 0;
          do {
            close(local_88[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar7 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 2));
        }
        bVar1 = false;
      }
      else {
        iVar3 = unaff_R15D;
        if ((char)local_4c == '\0') {
          local_6c = socket(2,2,0);
          if (local_6c == -1) {
            close(local_90);
            iVar3 = -0x4b;
            if (iStack_80._M_current != local_88) {
              uVar7 = 0;
              do {
                close(local_88[uVar7]);
                uVar7 = uVar7 + 1;
              } while (uVar7 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 2));
            }
            goto LAB_00120d0d;
          }
          uVar5 = (local_8a - 1) + (ushort)(local_8a < 2);
          if ((local_8a & 1) == 0) {
            uVar5 = local_8a | 1;
          }
          if (local_8a != 1) {
            local_68.sa_data[6] = '\0';
            local_68.sa_data[7] = '\0';
            local_68.sa_data[8] = '\0';
            local_68.sa_data[9] = '\0';
            local_68.sa_data[10] = '\0';
            local_68.sa_data[0xb] = '\0';
            local_68.sa_data[0xc] = '\0';
            local_68.sa_data[0xd] = '\0';
            local_68.sa_data._0_2_ = uVar5 << 8 | uVar5 >> 8;
            local_68.sa_family = 2;
            iVar4 = bind(local_6c,&local_68,0x10);
            if (iVar4 == 0) {
              uVar6 = uVar5;
              if (uVar5 < local_8a) {
                uVar6 = local_8a;
              }
              iVar3 = local_6c;
              uVar2 = uVar5;
              if (local_8a < uVar5) {
                iVar3 = local_90;
                uVar2 = local_8a;
              }
              *local_48 = iVar3;
              iVar3 = local_90;
              if (local_8a < uVar5) {
                iVar3 = local_6c;
              }
              *local_40 = iVar3;
              *local_38 = uVar2;
              *pRtcpPort = uVar6;
              if (iStack_80._M_current != local_88) {
                uVar7 = 0;
                do {
                  close(local_88[uVar7]);
                  uVar7 = uVar7 + 1;
                } while (uVar7 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 2));
              }
              goto LAB_00120da7;
            }
          }
          if (iStack_80._M_current == local_78) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_88,iStack_80,&local_90);
          }
          else {
            *iStack_80._M_current = local_90;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
          iVar4 = local_6c;
          if (iStack_80._M_current != local_78) goto LAB_00120f06;
          bVar1 = true;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_88,iStack_80,&local_6c);
        }
        else if (((byte)local_50 & (byte)local_8a) == 0) {
          *local_48 = local_90;
          *local_40 = local_90;
          *local_38 = local_8a;
          *pRtcpPort = local_8a;
          if (iStack_80._M_current != local_88) {
            uVar7 = 0;
            do {
              close(local_88[uVar7]);
              uVar7 = uVar7 + 1;
            } while (uVar7 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 2));
          }
LAB_00120da7:
          bVar1 = false;
          iVar3 = 0;
        }
        else {
          iVar4 = local_90;
          if (iStack_80._M_current == local_78) {
            bVar1 = true;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_88,iStack_80,&local_90);
          }
          else {
LAB_00120f06:
            *iStack_80._M_current = iVar4;
            iStack_80._M_current = iStack_80._M_current + 1;
            bVar1 = true;
          }
        }
      }
    }
    iVar8 = iVar8 + 1;
    unaff_R15D = iVar3;
  } while (bVar1);
  if (local_88 != (int *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return iVar3;
}

Assistant:

int GetAutoSockets(uint32_t bindIP, bool allowOdd, bool rtcpMux,
                   SocketType *pRtpSock, SocketType *pRtcpSock, 
                   uint16_t *pRtpPort, uint16_t *pRtcpPort)
{
	const int maxAttempts = 1024;
	int attempts = 0;
	vector<SocketType> toClose;

	while (attempts++ < maxAttempts)
	{
		SocketType sock = socket(PF_INET, SOCK_DGRAM, 0);
		if (sock == RTPSOCKERR)
		{
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
		}

		// First we get an automatically chosen port

		struct sockaddr_in addr;
		memset(&addr,0,sizeof(struct sockaddr_in));

		addr.sin_family = AF_INET;
		addr.sin_port = 0;
		addr.sin_addr.s_addr = htonl(bindIP);
		if (bind(sock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) != 0)
		{
			RTPCLOSE(sock);
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return ERR_RTP_UDPV4TRANS_CANTGETVALIDSOCKET;
		}

		uint16_t basePort = 0;
		int status = GetIPv4SocketPort(sock, &basePort);
		if (status < 0)
		{
			RTPCLOSE(sock);
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return status;
		}

		if (rtcpMux) // only need one socket
		{
			if (basePort%2 == 0 || allowOdd)
			{
				*pRtpSock = sock;
				*pRtcpSock = sock;
				*pRtpPort = basePort;
				*pRtcpPort = basePort;
				for (size_t i = 0 ; i < toClose.size() ; i++)
					RTPCLOSE(toClose[i]);

				return 0;
			}
			else
				toClose.push_back(sock);
		}
		else
		{
			SocketType sock2 = socket(PF_INET, SOCK_DGRAM, 0);
			if (sock2 == RTPSOCKERR)
			{
				RTPCLOSE(sock);
				for (size_t i = 0 ; i < toClose.size() ; i++)
					RTPCLOSE(toClose[i]);
				return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
			}

			// Try the next port or the previous port
			uint16_t secondPort = basePort;
			bool possiblyValid = false;

			if (basePort%2 == 0)
			{
				secondPort++;
				possiblyValid = true;
			}
			else if (basePort > 1) // avoid landing on port 0
			{
				secondPort--;
				possiblyValid = true;
			}

			if (possiblyValid)
			{
				memset(&addr,0,sizeof(struct sockaddr_in));

				addr.sin_family = AF_INET;
				addr.sin_port = htons(secondPort);
				addr.sin_addr.s_addr = htonl(bindIP);
				if (bind(sock2,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) == 0)
				{
					// In this case, we have two consecutive port numbers, the lower of
					// which is even

					if (basePort < secondPort)
					{
						*pRtpSock = sock;
						*pRtcpSock = sock2;
						*pRtpPort = basePort;
						*pRtcpPort = secondPort;
					}
					else
					{
						*pRtpSock = sock2;
						*pRtcpSock = sock;
						*pRtpPort = secondPort;
						*pRtcpPort = basePort;
					}

					for (size_t i = 0 ; i < toClose.size() ; i++)
						RTPCLOSE(toClose[i]);

					return 0;
				}
			}

			toClose.push_back(sock);
			toClose.push_back(sock2);
		}
	}

	for (size_t i = 0 ; i < toClose.size() ; i++)
		RTPCLOSE(toClose[i]);

	return ERR_RTP_UDPV4TRANS_TOOMANYATTEMPTSCHOOSINGSOCKET;
}